

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_node::append_buffer
          (xml_parse_result *__return_storage_ptr__,xml_node *this,void *contents,size_t size,
          uint options,xml_encoding encoding)

{
  bool bVar1;
  xml_node_type parent;
  undefined1 local_50 [8];
  name_null_sentry sentry;
  xml_extra_buffer *extra;
  xml_memory_page *page;
  xml_document_struct *doc;
  xml_encoding encoding_local;
  uint options_local;
  size_t size_local;
  void *contents_local;
  xml_node *this_local;
  
  doc._0_4_ = encoding;
  doc._4_4_ = options;
  _encoding_local = size;
  size_local = (size_t)contents;
  contents_local = this;
  parent = type(this);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,node_element);
  if (bVar1) {
    page = (xml_memory_page *)impl::anon_unknown_0::get_document<pugi::xml_node_struct>(this->_root)
    ;
    (((xml_document_struct *)page)->super_xml_node_struct).header =
         (((xml_document_struct *)page)->super_xml_node_struct).header | 0x40;
    extra = (xml_extra_buffer *)0x0;
    sentry.name = (char_t *)
                  impl::anon_unknown_0::xml_allocator::allocate_memory
                            (&((xml_document_struct *)page)->super_xml_allocator,0x18,
                             (xml_memory_page **)&extra);
    if ((xml_memory_page *)sentry.name == (xml_memory_page *)0x0) {
      impl::anon_unknown_0::make_parse_result(__return_storage_ptr__,status_out_of_memory,0);
    }
    else {
      ((xml_memory_page *)sentry.name)->allocator = (xml_allocator *)0x0;
      ((xml_memory_page *)sentry.name)->prev = page[2].prev;
      page[2].prev = (xml_memory_page *)sentry.name;
      impl::anon_unknown_0::name_null_sentry::name_null_sentry
                ((name_null_sentry *)local_50,this->_root);
      impl::anon_unknown_0::load_buffer_impl
                (__return_storage_ptr__,(xml_document_struct *)page,this->_root,(void *)size_local,
                 _encoding_local,doc._4_4_,(xml_encoding)doc,false,false,(char_t **)sentry.name);
      impl::anon_unknown_0::name_null_sentry::~name_null_sentry((name_null_sentry *)local_50);
    }
  }
  else {
    impl::anon_unknown_0::make_parse_result(__return_storage_ptr__,status_append_invalid_root,0);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_node::append_buffer(const void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		// append_buffer is only valid for elements/documents
		if (!impl::allow_insert_child(type(), node_element)) return impl::make_parse_result(status_append_invalid_root);

		// get document node
		impl::xml_document_struct* doc = &impl::get_document(_root);

		// disable document_buffer_order optimization since in a document with multiple buffers comparing buffer pointers does not make sense
		doc->header |= impl::xml_memory_page_contents_shared_mask;

		// get extra buffer element (we'll store the document fragment buffer there so that we can deallocate it later)
		impl::xml_memory_page* page = 0;
		impl::xml_extra_buffer* extra = static_cast<impl::xml_extra_buffer*>(doc->allocate_memory(sizeof(impl::xml_extra_buffer) + sizeof(void*), page));
		(void)page;

		if (!extra) return impl::make_parse_result(status_out_of_memory);

	#ifdef PUGIXML_COMPACT
		// align the memory block to a pointer boundary; this is required for compact mode where memory allocations are only 4b aligned
		// note that this requires up to sizeof(void*)-1 additional memory, which the allocation above takes into account
		extra = reinterpret_cast<impl::xml_extra_buffer*>((reinterpret_cast<uintptr_t>(extra) + (sizeof(void*) - 1)) & ~(sizeof(void*) - 1));
	#endif

		// add extra buffer to the list
		extra->buffer = 0;
		extra->next = doc->extra_buffers;
		doc->extra_buffers = extra;

		// name of the root has to be NULL before parsing - otherwise closing node mismatches will not be detected at the top level
		impl::name_null_sentry sentry(_root);

		return impl::load_buffer_impl(doc, _root, const_cast<void*>(contents), size, options, encoding, false, false, &extra->buffer);
	}